

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::StructurePatternSyntax::StructurePatternSyntax
          (StructurePatternSyntax *this,Token openBrace,
          SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *members,Token closeBrace
          )

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  StructurePatternMemberSyntax *pSVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax> *__range2;
  iterator __begin2;
  iterator_base<slang::syntax::StructurePatternMemberSyntax_*> local_30;
  
  uVar5 = openBrace._0_8_;
  uVar6 = closeBrace._0_8_;
  (this->super_PatternSyntax).super_SyntaxNode.kind = StructurePattern;
  (this->super_PatternSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_PatternSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (this->openBrace).kind = (short)uVar5;
  (this->openBrace).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openBrace).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openBrace).info = openBrace.info;
  uVar3 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (members->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (members->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a4980;
  sVar1 = (members->elements)._M_extent._M_extent_value;
  (this->members).elements._M_ptr = (members->elements)._M_ptr;
  (this->members).elements._M_extent._M_extent_value = sVar1;
  (this->closeBrace).kind = (short)uVar6;
  (this->closeBrace).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeBrace).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeBrace).info = closeBrace.info;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_30.index = 0;
  sVar1 = (this->members).elements._M_extent._M_extent_value;
  local_30.list = &this->members;
  for (; (local_30.list != &this->members || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pSVar4 = SeparatedSyntaxList<slang::syntax::StructurePatternMemberSyntax>::
             iterator_base<slang::syntax::StructurePatternMemberSyntax_*>::dereference(&local_30);
    (pSVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

StructurePatternSyntax(Token openBrace, const SeparatedSyntaxList<StructurePatternMemberSyntax>& members, Token closeBrace) :
        PatternSyntax(SyntaxKind::StructurePattern), openBrace(openBrace), members(members), closeBrace(closeBrace) {
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
    }